

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::resolver::async_resolve
          (resolver *this,string *host,resolver_flags flags,callback_t *h)

{
  io_context *piVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  *this_00;
  bool local_359;
  bool local_341;
  resolver *local_320;
  code *local_318;
  undefined8 local_310;
  type local_308;
  string_view local_2d0;
  string_view local_2c0;
  resolver *local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  type local_298;
  string_view local_260;
  string_view local_250;
  undefined1 local_23b;
  uchar local_23a;
  bitfield_flag local_239;
  _Base_ptr local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
  local_230;
  const_iterator local_1f0;
  _Self local_1e8;
  byte local_1d9;
  iterator iStack_1d8;
  bool done;
  iterator iter;
  bitfield_flag local_1a9;
  type local_1a8;
  undefined1 auStack_178 [8];
  error_code error_code;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_160;
  undefined1 local_153;
  uchar local_152;
  bitfield_flag local_151;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
  local_150;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_true>
  local_148;
  iterator k;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_110;
  undefined1 local_f8 [8];
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ips;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d8;
  undefined1 local_cb;
  uchar local_ca;
  bitfield_flag local_c9;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
  local_c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_true>
  local_c0;
  iterator i;
  type local_a8;
  undefined1 local_58 [8];
  address ip;
  error_code ec;
  callback_t *h_local;
  string *host_local;
  resolver *this_local;
  resolver_flags flags_local;
  
  boost::system::error_code::error_code((error_code *)&ip.ipv6_address_.scope_id_);
  boost::asio::ip::make_address((address *)local_58,host,(error_code *)&ip.ipv6_address_.scope_id_);
  bVar2 = boost::system::error_code::operator_cast_to_bool
                    ((error_code *)&ip.ipv6_address_.scope_id_);
  if (bVar2) {
    boost::system::error_code::clear((error_code *)&ip.ipv6_address_.scope_id_);
    local_c0._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>_>
         ::find(&this->m_cache,host);
    local_c8._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>_>
         ::end(&this->m_cache);
    bVar2 = ::std::__detail::operator!=(&local_c0,&local_c8);
    if (bVar2) {
      local_cb = 1;
      local_ca = flags.m_val;
      local_c9 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>)
                            flags.m_val,
                            (bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>)
                            0x1);
      bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_c9);
      local_341 = true;
      if (!bVar2) {
        ppVar3 = ::std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_false,_true>
                               *)&local_c0);
        local_d8 = ::std::chrono::operator+(&(ppVar3->second).last_seen,&this->m_timeout);
        ips.super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)time_now();
        local_341 = ::std::chrono::operator>=
                              (&local_d8,
                               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&ips.
                                   super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (local_341 != false) {
        ppVar3 = ::std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>,_false,_true>
                               *)&local_c0);
        ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                  ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                   local_f8,&(ppVar3->second).addresses);
        piVar1 = this->m_ios;
        ::std::
        function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
        ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                    *)&k,h);
        ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                  (&local_110,
                   (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                   local_f8);
        boost::asio::
        post<boost::asio::io_context,libtorrent::aux::resolver::async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)::__1>
                  (piVar1,(type *)&k,(type *)0x0);
        async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)
        ::$_1::~__1((__1 *)&k);
        ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::~vector
                  ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                   local_f8);
        return;
      }
    }
    local_148._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>_>
         ::find(&this->m_failed_cache,host);
    local_150._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>_>
         ::end(&this->m_failed_cache);
    bVar2 = ::std::__detail::operator!=(&local_148,&local_150);
    if (bVar2) {
      local_153 = 1;
      local_152 = flags.m_val;
      local_151 = (bitfield_flag)
                  libtorrent::flags::operator&
                            ((bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>
                             )flags.m_val,
                             (bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>
                             )0x1);
      bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_151);
      local_359 = true;
      if (!bVar2) {
        ppVar4 = ::std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_false,_true>
                               *)&local_148);
        local_160 = ::std::chrono::operator+(&(ppVar4->second).last_seen,&this->m_timeout);
        error_code.cat_ = (error_category *)time_now();
        local_359 = ::std::chrono::operator>=
                              (&local_160,
                               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&error_code.cat_);
      }
      if (local_359 != false) {
        ppVar4 = ::std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>,_false,_true>
                               *)&local_148);
        auStack_178._0_4_ = (ppVar4->second).error.val_;
        auStack_178[4] = (ppVar4->second).error.failed_;
        auStack_178._5_3_ = *(undefined3 *)&(ppVar4->second).error.field_0x5;
        error_code._0_8_ = (ppVar4->second).error.cat_;
        piVar1 = this->m_ios;
        ::std::
        function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
        ::function(&local_1a8.h,h);
        local_1a8.error_code.val_ = auStack_178._0_4_;
        local_1a8.error_code.failed_ = (bool)auStack_178[4];
        local_1a8.error_code._5_3_ = auStack_178._5_3_;
        local_1a8.error_code.cat_ = (error_category *)error_code._0_8_;
        boost::asio::
        post<boost::asio::io_context,libtorrent::aux::resolver::async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)::__2>
                  (piVar1,&local_1a8,(type *)0x0);
        async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)
        ::$_2::~__2((__2 *)&local_1a8);
        return;
      }
    }
    local_1a9 = (bitfield_flag)
                libtorrent::flags::operator&
                          ((bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>)
                           flags.m_val,
                           (bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>)
                           0x1);
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1a9);
    if (bVar2) {
      piVar1 = this->m_ios;
      ::std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function((function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                  *)&iter,h);
      boost::asio::
      post<boost::asio::io_context,libtorrent::aux::resolver::async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)::__3>
                (piVar1,(type *)&iter,(type *)0x0);
      async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)
      ::$_3::~__3((__3 *)&iter);
    }
    else {
      this_00 = &this->m_callbacks;
      iStack_1d8 = ::std::
                   multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
                   ::find(this_00,host);
      local_1e8._M_node =
           (_Base_ptr)
           ::std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
           ::end(this_00);
      local_1d9 = ::std::operator!=(&stack0xfffffffffffffe28,&local_1e8);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>
      ::_Rb_tree_const_iterator(&local_1f0,&stack0xfffffffffffffe28);
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
      ::
      pair<std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_true>
                (&local_230,host,h);
      local_238 = (_Base_ptr)
                  ::std::
                  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
                  ::insert(this_00,local_1f0,&local_230);
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>
      ::~pair(&local_230);
      if ((local_1d9 & 1) == 0) {
        local_23b = 2;
        local_23a = flags.m_val;
        local_239 = (bitfield_flag)
                    libtorrent::flags::operator&
                              ((bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>
                                )flags.m_val,
                               (bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>
                                )0x2);
        bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_239);
        if (bVar2) {
          local_250 = (string_view)
                      ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)host);
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_260,"80");
          local_2a8 = on_lookup;
          local_2a0 = 0;
          local_2b0 = this;
          ::std::
          bind<void(libtorrent::aux::resolver::*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&),libtorrent::aux::resolver*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::__cxx11::string_const&>
                    (&local_298,(offset_in_resolver_to_subr *)&local_2a8,&local_2b0,
                     (_Placeholder<1> *)&::std::placeholders::_1,
                     (_Placeholder<2> *)&::std::placeholders::_2,host);
          boost::asio::ip::
          basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
          ::
          async_resolve<std::_Bind<void(libtorrent::aux::resolver::*(libtorrent::aux::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&)>>
                    ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                      *)&this->m_resolver,local_250,local_260,&local_298);
          ::std::
          _Bind<void_(libtorrent::aux::resolver::*(libtorrent::aux::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~_Bind(&local_298);
        }
        else {
          local_2c0 = (string_view)
                      ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)host);
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_2d0,"80");
          local_318 = on_lookup;
          local_310 = 0;
          local_320 = this;
          ::std::
          bind<void(libtorrent::aux::resolver::*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&),libtorrent::aux::resolver*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::__cxx11::string_const&>
                    (&local_308,(offset_in_resolver_to_subr *)&local_318,&local_320,
                     (_Placeholder<1> *)&::std::placeholders::_1,
                     (_Placeholder<2> *)&::std::placeholders::_2,host);
          boost::asio::ip::
          basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
          ::
          async_resolve<std::_Bind<void(libtorrent::aux::resolver::*(libtorrent::aux::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,std::__cxx11::string_const&)>>
                    ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                      *)&this->m_critical_resolver,local_2c0,local_2d0,&local_308);
          ::std::
          _Bind<void_(libtorrent::aux::resolver::*(libtorrent::aux::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~_Bind(&local_308);
        }
      }
    }
  }
  else {
    piVar1 = this->m_ios;
    ::std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function(&local_a8.h,h);
    local_a8.ec.val_ = (undefined4)ip.ipv6_address_.scope_id_;
    local_a8.ec.failed_ = (bool)ip.ipv6_address_.scope_id_._4_1_;
    local_a8.ec._5_3_ = ip.ipv6_address_.scope_id_._5_3_;
    boost::asio::ip::address::address(&local_a8.ip,(address *)local_58);
    boost::asio::
    post<boost::asio::io_context,libtorrent::aux::resolver::async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)::__0>
              (piVar1,&local_a8,(type *)0x0);
    async_resolve(std::__cxx11::string_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::resolver_flag_tag,void>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>)
    ::$_0::~__0((__0 *)&local_a8);
  }
  return;
}

Assistant:

void resolver::async_resolve(std::string const& host, resolver_flags const flags
		, resolver_interface::callback_t h)
	{
		// special handling for raw IP addresses. There's no need to get in line
		// behind actual lookups if we can just resolve it immediately.
		error_code ec;
		address const ip = make_address(host, ec);
		if (!ec)
		{
			post(m_ios, [h, ec, ip]{ callback(h, ec, std::vector<address>{ip}); });
			return;
		}
		ec.clear();

		auto const i = m_cache.find(host);
		if (i != m_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| i->second.last_seen + m_timeout >= time_now())
			{
				std::vector<address> ips = i->second.addresses;
				post(m_ios, [h, ec, ips] { callback(h, ec, ips); });
				return;
			}
		}

		auto const k = m_failed_cache.find(host);
		if (k != m_failed_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| k->second.last_seen + m_timeout >= time_now())
			{
				error_code error_code = k->second.error;
				post(m_ios, [h, error_code] { callback(h, error_code, {}); });
				return;
			}
		}

		if (flags & resolver_interface::cache_only)
		{
			// we did not find a cache entry, fail the lookup
			post(m_ios, [h] {
				callback(h, boost::asio::error::host_not_found, std::vector<address>{});
			});
			return;
		}

		auto iter = m_callbacks.find(host);
		bool const done = (iter != m_callbacks.end());

		m_callbacks.insert(iter, {host, std::move(h)});

		// if there is an existing outtanding lookup, our callback will be
		// called once it completes. We're done here.
		if (done) return;

		// the port is ignored
		using namespace std::placeholders;
		ADD_OUTSTANDING_ASYNC("resolver::on_lookup");
		if (flags & resolver_interface::abort_on_shutdown)
		{
			m_resolver.async_resolve(host, "80", std::bind(&resolver::on_lookup, this, _1, _2
				, host));
		}
		else
		{
			m_critical_resolver.async_resolve(host, "80", std::bind(&resolver::on_lookup, this, _1, _2
				, host));
		}
	}